

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O0

void copyTo<BupHeaderSwitch>(BupHeader *out,BupHeaderSwitch *in)

{
  value_type_conflict4 vVar1;
  size_type in_RDI;
  vector<BupChunk,_std::allocator<BupChunk>_> *unaff_retaddr;
  
  vVar1 = boost::endian::
          endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
          value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                 *)0x11bb4c);
  *(value_type_conflict4 *)(in_RDI + 4) = vVar1;
  vVar1 = boost::endian::
          endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
          value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                 *)0x11bb66);
  *(value_type_conflict4 *)(in_RDI + 2) = vVar1;
  vVar1 = boost::endian::
          endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
          value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                 *)0x11bb80);
  *(value_type_conflict4 *)(in_RDI + 6) = vVar1;
  vVar1 = boost::endian::
          endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
          value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                 *)0x11bb9a);
  *(value_type_conflict4 *)(in_RDI + 8) = vVar1;
  boost::endian::endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
  ::value((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0> *)
          0x11bbc2);
  std::vector<BupChunk,_std::allocator<BupChunk>_>::resize(unaff_retaddr,in_RDI);
  boost::endian::endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
  ::value((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0> *)
          0x11bbec);
  std::vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>::resize
            ((vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_> *)unaff_retaddr,in_RDI
            );
  return;
}

Assistant:

void copyTo(BupHeader& out, const Header& in) {
	out.eh = in.eh.value();
	out.ew = in.ew.value();
	out.width = in.width.value();
	out.height = in.height.value();
	out.chunks.resize(in.baseChunks.value());
	out.expChunks.resize(in.expChunks.value());
}